

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O2

void CTcMain::tc_err_term(void)

{
  err_refs_ = err_refs_ + -1;
  err_terminate();
  if (err_refs_ != 0) {
    return;
  }
  err_delete_message_array
            (&tc_messages,&tc_message_count,tc_messages_english,tc_message_count_english);
  return;
}

Assistant:

void CTcMain::tc_err_term()
{
    /* reduce the reference count */
    --err_refs_;

    /* delete the error stack */
    err_terminate();

    /* if this is the last reference, clean things up */
    if (err_refs_ == 0)
    {
        /* if we loaded an external message file, unload it */
        err_delete_message_array(&tc_messages, &tc_message_count,
                                 &tc_messages_english[0],
                                 tc_message_count_english);
    }
}